

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

PolymorphicEmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitBrIf(WasmBytecodeGenerator *this)

{
  code *pcVar1;
  bool bVar2;
  WasmBinaryReader *pWVar3;
  BlockInfo *blockInfo;
  undefined4 *puVar4;
  EmitInfo EVar5;
  uint32 i;
  uint32 index;
  uint32 uVar6;
  PolymorphicEmitInfo PVar7;
  PolymorphicEmitInfo PVar8;
  EmitInfo local_58;
  EmitInfo conditionInfo;
  PolymorphicEmitInfo local_40;
  
  pWVar3 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar3 == (WasmBinaryReader *)0x0) {
    pWVar3 = (this->m_module->m_reader).ptr;
  }
  uVar6 = (pWVar3->super_WasmReaderBase).m_currentNode.field_1.brTable.numTargets;
  local_58 = PopEvalStack(this,FirstLocalType,L"br_if condition must have i32 type");
  ReleaseLocation(this,&local_58);
  local_40.field_1.infos = (EmitInfo *)0x0;
  blockInfo = GetBlockInfo(this,uVar6);
  conditionInfo = (EmitInfo)this;
  if ((blockInfo->yieldInfo).count == 0) {
    uVar6 = 0;
  }
  else {
    PVar7 = PopStackPolymorphic(this,blockInfo,(char16 *)0x0);
    local_40.field_1 = PVar7.field_1;
    local_40.count = PVar7.count;
    PVar7._4_4_ = 0;
    PVar7.count = local_40.count;
    PVar7.field_1.infos = local_40.field_1.infos;
    YieldToBlock(this,blockInfo,PVar7);
    bVar2 = PolymorphicEmitInfo::IsUnreachable(&local_40);
    uVar6 = local_40.count;
    if (!bVar2) goto LAB_00d70bd9;
    if (this->isUnreachable == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                         ,0x6f0,"(IsUnreachable())","IsUnreachable()");
      if (!bVar2) goto LAB_00d70c10;
      *puVar4 = 0;
    }
    uVar6 = local_40.count;
    if (local_40.count != (blockInfo->yieldInfo).count) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                         ,0x6f1,"(info.Count() == blockInfo->yieldInfo.Count())",
                         "info.Count() == blockInfo->yieldInfo.Count()");
      if (!bVar2) {
LAB_00d70c10:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    for (index = 0; index < uVar6; index = index + 1) {
      EVar5 = PolymorphicEmitInfo::GetInfo(&blockInfo->yieldInfo,index);
      PolymorphicEmitInfo::SetInfo(&local_40,(EmitInfo)((ulong)EVar5 | 0xffffffff),index);
      uVar6 = local_40.count;
    }
  }
LAB_00d70bd9:
  (**(code **)(**(long **)((long)conditionInfo + 0xb8) + 0xd0))
            (*(long **)((long)conditionInfo + 0xb8),0x26,blockInfo->label,
             (ulong)local_58 & 0xffffffff);
  PVar8._4_4_ = 0;
  PVar8.count = uVar6;
  PVar8.field_1.singleInfo = local_40.field_1.singleInfo;
  return PVar8;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EmitBrIf()
{
    uint32 depth = GetReader()->m_currentNode.br.depth;

    EmitInfo conditionInfo = PopEvalStack(WasmTypes::I32, _u("br_if condition must have i32 type"));
    ReleaseLocation(&conditionInfo);

    PolymorphicEmitInfo info;
    BlockInfo* blockInfo = GetBlockInfo(depth);

    if (blockInfo->HasYield())
    {
        info = PopStackPolymorphic(blockInfo);
        YieldToBlock(blockInfo, info);
        if (info.IsUnreachable())
        {
            Assert(IsUnreachable());
            Assert(info.Count() == blockInfo->yieldInfo.Count());
            // Use the block's yield type to continue type check
            for (uint32 i = 0; i < info.Count(); ++i)
            {
                info.SetInfo(EmitInfo(blockInfo->yieldInfo.GetInfo(i).type), i);
            }
        }
    }

    m_writer->AsmBrReg1(Js::OpCodeAsmJs::BrTrue_Int, blockInfo->label, conditionInfo.location);

    return info;
}